

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

void __thiscall fmt::v5::file::file(file *this,cstring_view path,int oflag)

{
  int iVar1;
  char *__file;
  int *piVar2;
  undefined8 uVar3;
  int in_EDX;
  undefined8 in_RSI;
  char **in_RDI;
  bool bVar4;
  system_error *unaff_retaddr;
  string_view in_stack_00000008;
  int mode;
  char *in_stack_ffffffffffffff98;
  basic_string_view<char> *in_stack_ffffffffffffffa0;
  char **args;
  basic_cstring_view<char> local_8 [4];
  int error_code;
  
  args = in_RDI;
  uVar3 = in_RSI;
  do {
    _local_8 = uVar3;
    __file = basic_cstring_view<char>::c_str(local_8);
    iVar1 = open(__file,in_EDX,0x180);
    *(int *)in_RDI = iVar1;
    bVar4 = false;
    if (*(int *)in_RDI == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
    uVar3 = _local_8;
    error_code = (int)((ulong)_local_8 >> 0x20);
  } while (bVar4);
  if (*(int *)in_RDI == -1) {
    uVar3 = __cxa_allocate_exception(0x18);
    __errno_location();
    basic_string_view<char>::basic_string_view(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    basic_cstring_view<char>::c_str(local_8);
    system_error::system_error<char_const*>(unaff_retaddr,error_code,in_stack_00000008,args);
    __cxa_throw(uVar3,&system_error::typeinfo,system_error::~system_error);
  }
  return;
}

Assistant:

file::file(cstring_view path, int oflag) {
  int mode = S_IRUSR | S_IWUSR;
#if defined(_WIN32) && !defined(__MINGW32__)
  fd_ = -1;
  FMT_POSIX_CALL(sopen_s(&fd_, path.c_str(), oflag, _SH_DENYNO, mode));
#else
  FMT_RETRY(fd_, FMT_POSIX_CALL(open(path.c_str(), oflag, mode)));
#endif
  if (fd_ == -1)
    FMT_THROW(system_error(errno, "cannot open file {}", path.c_str()));
}